

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_basename(mcu8str *path)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  mcu8str *in_RSI;
  mcu8str *in_RDI;
  bool bVar6;
  mcu8str_size_t bnsize;
  char *it;
  char *itE;
  char *itB;
  mcu8str *prealloc_size;
  char *local_20;
  char *local_10;
  
  local_10 = in_RSI->c_str;
  pcVar4 = in_RSI->c_str + in_RSI->size;
  prealloc_size = in_RDI;
  iVar3 = mctools_impl_has_winnamespace(in_RSI);
  if (iVar3 != 0) {
    local_10 = local_10 + 4;
  }
  cVar2 = mctools_drive_letter(in_RDI);
  if (cVar2 != '\0') {
    local_10 = local_10 + 2;
  }
  local_20 = pcVar4;
  if (local_10 == pcVar4) {
    mcu8str_create_empty();
  }
  else {
    do {
      pcVar1 = local_20;
      local_20 = pcVar1 + -1;
      bVar6 = false;
      if ((local_10 < local_20) && (bVar6 = false, *local_20 != '/')) {
        bVar6 = *local_20 != '\\';
      }
    } while (bVar6);
    if ((*local_20 == '/') || (*local_20 == '\\')) {
      local_20 = pcVar1;
    }
    lVar5 = (long)pcVar4 - (long)local_20;
    if ((lVar5 == 0) || ((lVar5 == 1 && (*local_20 == '.')))) {
      mcu8str_create_empty();
    }
    else {
      mcu8str_create((mcu8str_size_t)prealloc_size);
      memcpy(in_RDI->c_str,local_20,lVar5 + 1);
      in_RDI->size = (uint)lVar5;
    }
  }
  return prealloc_size;
}

Assistant:

mcu8str mctools_basename( const mcu8str* path )
  {
    const char * itB = path->c_str;
    const char * itE = path->c_str + path->size;

    if ( mctools_impl_has_winnamespace( path ) )
      itB += 4;//skip '\\?\'
    if ( mctools_drive_letter( path ) )
      itB += 2;//skip drive letter

    if ( itB == itE )
      return mcu8str_create_empty();

    //Find last path sep:
    const char * it = itE - 1;
    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    if ( *it=='/' || *it=='\\' )
      ++it;
    mcu8str_size_t bnsize = (mcu8str_size_t)(itE - it);
    if ( bnsize == 0 || ( bnsize==1 && *it=='.' ) )
      return mcu8str_create_empty();
    mcu8str res = mcu8str_create( bnsize );
    STDNS memcpy( res.c_str, it, bnsize + 1 );
    res.size = (unsigned)bnsize;//cast ok due to mcu8str_create
    return res;
  }